

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Gia_Obj_t * Gia_ManEquivRepr(Gia_Man_t *p,Gia_Obj_t *pObj,int fUseAll,int fDualOut)

{
  Gia_Rpr_t GVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  
  pGVar2 = p->pObjs;
  if (fUseAll == 0) {
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_001fd162;
    if ((p->pReprs[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555].field_0x3 & 0x10)
        == 0) {
      return (Gia_Obj_t *)0x0;
    }
  }
  else {
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_001fd162;
    if ((~(uint)p->pReprs[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555] & 0xfffffff)
        == 0) {
      return (Gia_Obj_t *)0x0;
    }
  }
  if (fDualOut != 0) {
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_001fd162;
    GVar1 = p->pReprs[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555];
    if (((uint)GVar1 ^ (uint)p->pReprs[(uint)GVar1 & 0xfffffff]) < 0x40000000) {
      return (Gia_Obj_t *)0x0;
    }
  }
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    uVar3 = (uint)p->pReprs[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555] &
            0xfffffff;
    if (p->nObjs <= (int)uVar3) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    return pGVar2 + uVar3;
  }
LAB_001fd162:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline Gia_Obj_t * Gia_ManEquivRepr( Gia_Man_t * p, Gia_Obj_t * pObj, int fUseAll, int fDualOut )
{
    if ( fUseAll )
    {
        if ( Gia_ObjRepr(p, Gia_ObjId(p,pObj)) == GIA_VOID )
            return NULL;
    }
    else
    {
        if ( !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
            return NULL;
    }
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjRepr(p, Gia_ObjId(p,pObj)) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjRepr(p, Gia_ObjId(p,pObj)) ) )
        return NULL;
    return Gia_ManObj( p, Gia_ObjRepr(p, Gia_ObjId(p,pObj)) );
}